

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::internal::UnitTestOptions::FilterMatchesTest(string *test_case_name,string *test_name)

{
  pointer pcVar1;
  bool bVar2;
  long *plVar3;
  char *pcVar4;
  size_t sVar5;
  size_type *psVar6;
  char *pcVar7;
  char **ppcVar8;
  string positive;
  string negative;
  char *local_b0;
  long local_a8;
  char local_a0 [16];
  string local_90;
  char *local_70;
  char *local_68;
  char local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pcVar1 = (test_case_name->_M_dataplus)._M_p;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + test_case_name->_M_string_length);
  std::__cxx11::string::append((char *)&local_b0);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  psVar6 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_90.field_2._M_allocated_capacity = *psVar6;
    local_90.field_2._8_8_ = plVar3[3];
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar6;
    local_90._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_90._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  pcVar7 = FLAGS_gtest_filter_abi_cxx11_;
  pcVar4 = strchr(FLAGS_gtest_filter_abi_cxx11_,0x2d);
  local_a8 = 0;
  local_a0[0] = '\0';
  local_68 = (char *)0x0;
  local_60[0] = '\0';
  local_70 = local_60;
  if (pcVar4 == (char *)0x0) {
    local_b0 = local_a0;
    strlen(pcVar7);
    std::__cxx11::string::_M_replace((ulong)&local_b0,0,(char *)0x0,(ulong)pcVar7);
    ppcVar8 = &local_70;
    pcVar4 = "";
    pcVar7 = local_68;
  }
  else {
    local_b0 = local_a0;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar7,pcVar4);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    local_50[0] = local_40;
    sVar5 = strlen(pcVar4 + 1);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,pcVar4 + 1,pcVar4 + sVar5 + 1);
    std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if (local_a8 != 0) goto LAB_00121e24;
    pcVar4 = "*";
    ppcVar8 = &local_b0;
    pcVar7 = (char *)0x0;
  }
  std::__cxx11::string::_M_replace((ulong)ppcVar8,0,pcVar7,(ulong)pcVar4);
LAB_00121e24:
  pcVar7 = local_b0;
  bVar2 = MatchesFilter(&local_90,local_b0);
  pcVar4 = local_70;
  if (bVar2) {
    bVar2 = MatchesFilter(&local_90,local_70);
    bVar2 = !bVar2;
  }
  else {
    bVar2 = false;
  }
  if (pcVar4 != local_60) {
    operator_delete(pcVar4);
    pcVar7 = local_b0;
  }
  if (pcVar7 != local_a0) {
    operator_delete(pcVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

bool UnitTestOptions::FilterMatchesTest(const std::string &test_case_name,
                                        const std::string &test_name) {
  const std::string& full_name = test_case_name + "." + test_name.c_str();

  // Split --gtest_filter at '-', if there is one, to separate into
  // positive filter and negative filter portions
  const char* const p = GTEST_FLAG(filter).c_str();
  const char* const dash = strchr(p, '-');
  std::string positive;
  std::string negative;
  if (dash == NULL) {
    positive = GTEST_FLAG(filter).c_str();  // Whole string is a positive filter
    negative = "";
  } else {
    positive = std::string(p, dash);   // Everything up to the dash
    negative = std::string(dash + 1);  // Everything after the dash
    if (positive.empty()) {
      // Treat '-test1' as the same as '*-test1'
      positive = kUniversalFilter;
    }
  }

  // A filter is a colon-separated list of patterns.  It matches a
  // test if any pattern in it matches the test.
  return (MatchesFilter(full_name, positive.c_str()) &&
          !MatchesFilter(full_name, negative.c_str()));
}